

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall JSON::Parser::readWordToken(Token *__return_storage_ptr__,Parser *this)

{
  int start;
  bool bVar1;
  int code;
  bool local_89;
  string local_60 [32];
  string local_40 [8];
  string value;
  int chunkStart;
  Parser *this_local;
  
  start = this->pos;
  while( true ) {
    bVar1 = isValidPos(this);
    local_89 = false;
    if (bVar1) {
      code = getCodeAt(this,this->pos);
      local_89 = isWordChar(code);
    }
    if (local_89 == false) break;
    this->pos = this->pos + 1;
  }
  std::__cxx11::string::substr((ulong)local_40,(ulong)&this->input);
  std::__cxx11::string::string(local_60,local_40);
  Token::Token(__return_storage_ptr__,WORD,(string *)local_60,start,this->pos);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

Token Parser::readWordToken() {
        int chunkStart = pos;
        while (isValidPos() && isWordChar(getCodeAt(pos))) {
            pos++;
        }

        string value = input.substr(chunkStart, pos - chunkStart);
        return Token(WORD, value, chunkStart, pos);
    }